

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_inst.c
# Opt level: O3

void select_op(vm *v,instruction *inst)

{
  _Bool _Var1;
  uint64 val;
  
  _Var1 = popBool(&v->operandStack);
  val = popU64(&v->operandStack);
  if (_Var1) {
    return;
  }
  popU64(&v->operandStack);
  pushU64(&v->operandStack,val);
  return;
}

Assistant:

void select_op(vm *v, instruction *inst) {
    stack *s = &v->operandStack;
    if (popBool(s)) {
        popU64(s);
    } else {
        uint64 a = popU64(s);
        popU64(s);
        pushU64(s, a);
    }
}